

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_critical_rate_simulation.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  double dVar2;
  unsigned_long num_frames_to_test;
  unsigned_long max_num_iter;
  unsigned_long __sd;
  unsigned_long update_console_every_n_frames;
  ostream *poVar3;
  string *generalProgramDescriptionForHelpText;
  pointer puVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> syndrome_size_success;
  undefined4 local_b48;
  undefined4 uStack_b44;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> rate_adaption_file_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> code_file_path;
  string local_af8;
  RateAdaptiveCode<unsigned_int> H;
  Parser parser;
  mt19937_64 rng;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_af8,
             "Slepian-Wolf Critical Code Rate Simulator for Rate Adapted LDPC Codes\n\nIn a Slepian-Wolf coding setting, for a given codeword and noised codeword, there is a minimum coding rate at which the syndrome decoding succeeds.\nThis program determines the average minimum coding rate across many noised codewords."
             ,(allocator<char> *)&rng);
  generalProgramDescriptionForHelpText = &local_af8;
  cli::Parser::Parser(&parser,argc,argv,generalProgramDescriptionForHelpText);
  std::__cxx11::string::~string((string *)&local_af8);
  configure_parser(&parser);
  cli::Parser::run_and_exit_if_error(&parser);
  std::__cxx11::string::string<std::allocator<char>>((string *)&rng,"p",(allocator<char> *)&H);
  dVar1 = cli::Parser::get<double>(&parser,(string *)&rng);
  std::__cxx11::string::~string((string *)&rng);
  std::__cxx11::string::string<std::allocator<char>>((string *)&rng,"nf",(allocator<char> *)&H);
  num_frames_to_test = cli::Parser::get<unsigned_long>(&parser,(string *)&rng);
  std::__cxx11::string::~string((string *)&rng);
  std::__cxx11::string::string<std::allocator<char>>((string *)&rng,"i",(allocator<char> *)&H);
  max_num_iter = cli::Parser::get<unsigned_long>(&parser,(string *)&rng);
  std::__cxx11::string::~string((string *)&rng);
  std::__cxx11::string::string<std::allocator<char>>((string *)&rng,"s",(allocator<char> *)&H);
  __sd = cli::Parser::get<unsigned_long>(&parser,(string *)&rng);
  std::__cxx11::string::~string((string *)&rng);
  std::__cxx11::string::string<std::allocator<char>>((string *)&rng,"upn",(allocator<char> *)&H);
  update_console_every_n_frames = cli::Parser::get<unsigned_long>(&parser,(string *)&rng);
  std::__cxx11::string::~string((string *)&rng);
  std::__cxx11::string::string<std::allocator<char>>((string *)&rng,"cp",(allocator<char> *)&H);
  cli::Parser::get<std::__cxx11::string>(&code_file_path,&parser,(string *)&rng);
  std::__cxx11::string::~string((string *)&rng);
  std::__cxx11::string::string<std::allocator<char>>((string *)&rng,"rp",(allocator<char> *)&H);
  cli::Parser::get<std::__cxx11::string>(&rate_adaption_file_path,&parser,(string *)&rng);
  std::__cxx11::string::~string((string *)&rng);
  LDPC4QKD::CodeSimulationHelpers::load_ldpc<bool,unsigned_int,unsigned_int>
            (&H,(CodeSimulationHelpers *)&code_file_path,&rate_adaption_file_path,
             generalProgramDescriptionForHelpText);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar3 = std::operator<<((ostream *)&std::cout,"LDPC Code loaded from file: ");
  poVar3 = std::operator<<(poVar3,(string *)&code_file_path);
  std::operator<<(poVar3,'\n');
  poVar3 = std::operator<<((ostream *)&std::cout,"Rate adaption loaded from file: ");
  poVar3 = std::operator<<(poVar3,(string *)&rate_adaption_file_path);
  std::operator<<(poVar3,'\n');
  poVar3 = std::operator<<((ostream *)&std::cout,"Code size: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3," x ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,'\n');
  std::operator<<((ostream *)&std::cout,"Running FER decoding test on channel parameter p : ");
  poVar3 = std::ostream::_M_insert<double>(dVar1);
  std::operator<<(poVar3,'\n');
  poVar3 = std::operator<<((ostream *)&std::cout,"Max number decoder iterations: ");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,(int)max_num_iter);
  std::operator<<(poVar3,'\n');
  poVar3 = std::operator<<((ostream *)&std::cout,"Number of frames to simulate: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,'\n');
  poVar3 = std::operator<<((ostream *)&std::cout,"PRNG seed: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,'\n');
  poVar3 = std::operator<<((ostream *)&std::cout,"\n");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::seed(&rng,__sd);
  std::chrono::_V2::steady_clock::now();
  run_simulation<LDPC4QKD::RateAdaptiveCode<unsigned_int>>
            (&syndrome_size_success,&H,dVar1,num_frames_to_test,&rng,max_num_iter,
             update_console_every_n_frames);
  std::chrono::_V2::steady_clock::now();
  poVar3 = std::operator<<((ostream *)&std::cout,"\n\nDONE! Simulation time: ");
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  poVar3 = std::operator<<(poVar3," seconds.");
  std::operator<<(poVar3,'\n');
  poVar3 = std::operator<<((ostream *)&std::cout,"all syndrome sizes:");
  std::endl<char,std::char_traits<char>>(poVar3);
  for (puVar4 = syndrome_size_success.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar4 != syndrome_size_success.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish; puVar4 = puVar4 + 1) {
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::operator<<(poVar3,' ');
  }
  std::operator<<((ostream *)&std::cout,"\n\n");
  dVar2 = LDPC4QKD::CodeSimulationHelpers::avg<unsigned_long>(&syndrome_size_success);
  poVar3 = std::operator<<((ostream *)&std::cout,"Average syndrome size (out of ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3," codewords tried): ");
  poVar3 = std::ostream::_M_insert<double>(dVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::operator<<((ostream *)&std::cout,"Average rate: ");
  local_b48 = (undefined4)H.n_cols;
  uStack_b44 = (undefined4)(H.n_cols >> 0x20);
  dVar2 = dVar2 / (((double)CONCAT44(0x45300000,uStack_b44) - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,local_b48) - 4503599627370496.0));
  poVar3 = std::ostream::_M_insert<double>(dVar2);
  std::operator<<(poVar3," (inefficiency f = ");
  dVar1 = LDPC4QKD::CodeSimulationHelpers::h2<double>(dVar1);
  poVar3 = std::ostream::_M_insert<double>(dVar2 / dVar1);
  poVar3 = std::operator<<(poVar3,")");
  std::endl<char,std::char_traits<char>>(poVar3);
  exit(0);
}

Assistant:

int main(int argc, char *argv[]) {
    // parse command line arguments
    cli::Parser parser(argc, argv, help_text);
    configure_parser(parser);
    parser.run_and_exit_if_error();

    auto p = parser.get<double>("p");
    auto num_frames_to_test = parser.get<std::size_t>("nf");
    auto max_bp_iter = parser.get<std::size_t>("i");
    auto rng_seed = parser.get<std::size_t>("s");
    auto update_console_every_n_frames = parser.get<std::size_t>("upn");
    auto code_file_path = parser.get<std::string>("cp");;
    auto rate_adaption_file_path = parser.get<std::string>("rp");;

    auto H = load_ldpc(code_file_path, rate_adaption_file_path);

    std::cout << std::endl;
    std::cout << "LDPC Code loaded from file: " << code_file_path << '\n';
    std::cout << "Rate adaption loaded from file: " << rate_adaption_file_path << '\n';
    std::cout << "Code size: " << H.get_n_rows_after_rate_adaption() << " x " << H.getNCols() << '\n';
    std::cout << "Running FER decoding test on channel parameter p : " << p << '\n';
    std::cout << "Max number decoder iterations: " << static_cast<int>(max_bp_iter) << '\n';
    std::cout << "Number of frames to simulate: " << num_frames_to_test << '\n';
    std::cout << "PRNG seed: " << rng_seed << '\n';
    std::cout << "\n" << std::endl;

    std::mt19937_64 rng(rng_seed);
    auto begin = std::chrono::steady_clock::now();

    auto syndrome_size_success = run_simulation(
            H, p, num_frames_to_test, rng,
            max_bp_iter, update_console_every_n_frames);

    auto now = std::chrono::steady_clock::now();
    std::cout << "\n\nDONE! Simulation time: " <<
              std::chrono::duration_cast<std::chrono::seconds>(now - begin).count() << " seconds." << '\n';


    std::cout << "all syndrome sizes:" << std::endl;
    for (auto s : syndrome_size_success) {
        std::cout << s << ' ';
    }
    std::cout << "\n\n";

    double avg_synd_size = avg(syndrome_size_success);
    std::cout << "Average syndrome size (out of " << num_frames_to_test << " codewords tried): " << avg_synd_size
              << std::endl;

    double avg_rate = avg_synd_size / static_cast<double>(H.getNCols());
    std::cout << "Average rate: " << avg_rate << " (inefficiency f = " << avg_rate / h2(p) << ")" << std::endl;
    exit(EXIT_SUCCESS);
}